

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdioLogSystem.cpp
# Opt level: O1

void __thiscall StdioLogSystem::LogInternal(StdioLogSystem *this,char *format,__va_list_tag *args)

{
  char *__s;
  size_t sVar1;
  
  __s = this->m_buff;
  vsnprintf(__s,0xfff,format,args);
  this->m_buff[0xfff] = '\0';
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  return;
}

Assistant:

void StdioLogSystem::LogInternal(const char * format, va_list args)
{
	vsnprintf(m_buff, LOGSYSTEM_MAX_BUFFER-1, format, args);
	// Make sure there's a limit to the amount of rubbish we can output
	m_buff[LOGSYSTEM_MAX_BUFFER-1] = '\0';

	std::cout << m_buff;
#ifdef _WIN32
	OutputDebugStringA( m_buff );
#endif
}